

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O2

Token __thiscall avro::json::JsonParser::doAdvance(JsonParser *this)

{
  char *pcVar1;
  uchar c;
  Token TVar2;
  _Elt_pointer pSVar3;
  Exception *__return_storage_ptr__;
  JsonParser *in_RSI;
  JsonParser *pJVar4;
  size_t sStack_20;
  
  c = next(this);
  if (c == ',') {
    if (this->curState != stArrayN) {
      if (this->curState != stObjectN) {
        __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
        unexpected(__return_storage_ptr__,in_RSI,',');
        goto LAB_001707f0;
      }
      this->curState = stObject0;
    }
LAB_0017069d:
    c = next(this);
  }
  else {
    if (c == ':') {
      if (this->curState != stKey) {
        __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
        unexpected(__return_storage_ptr__,in_RSI,':');
        goto LAB_001707f0;
      }
      this->curState = stObjectN;
      goto LAB_0017069d;
    }
    if (c == '}') {
      pSVar3 = (this->stateStack).c.
               super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar3 == (this->stateStack).c.
                    super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = (this->stateStack).c.
                 super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->curState = pSVar3[-1];
      std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
      pop_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                *)this);
      return tkObjectEnd;
    }
    if (c == ']') {
      pSVar3 = (this->stateStack).c.
               super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar3 == (this->stateStack).c.
                    super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = (this->stateStack).c.
                 super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->curState = pSVar3[-1];
      std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
      pop_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                *)this);
      return tkArrayEnd;
    }
  }
  pJVar4 = (JsonParser *)&this->curState;
  if (this->curState == stArray0) {
    *(State *)pJVar4 = stArrayN;
  }
  else if (this->curState == stObject0) {
    if (c != '\"') {
      __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
      unexpected(__return_storage_ptr__,pJVar4,c);
      goto LAB_001707f0;
    }
    *(State *)pJVar4 = stKey;
    goto LAB_0017070f;
  }
  if (c == '\"') {
LAB_0017070f:
    tryString(this);
    return tkString;
  }
  if (c == '{') {
    std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
    push_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               *)this,(value_type *)pJVar4);
    this->curState = stObject0;
    return tkObjectStart;
  }
  if (c == 'f') {
    this->bv = false;
    pcVar1 = "false";
    sStack_20 = 4;
  }
  else {
    if (c == 'n') {
      pcVar1 = "Null";
      sStack_20 = 3;
      TVar2 = tkNull;
      goto LAB_00170759;
    }
    if (c != 't') {
      if (c == '[') {
        std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
        push_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                   *)this,(value_type *)pJVar4);
        this->curState = stArray0;
        return tkArrayStart;
      }
      pJVar4 = (JsonParser *)(ulong)(uint)(int)(char)c;
      if ((c == '-') || ((int)(char)c - 0x30U < 10)) {
        TVar2 = tryNumber(this,c);
        return TVar2;
      }
      __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
      unexpected(__return_storage_ptr__,pJVar4,c);
LAB_001707f0:
      __cxa_throw(__return_storage_ptr__,&Exception::typeinfo,Exception::~Exception);
    }
    this->bv = true;
    pcVar1 = "true";
    sStack_20 = 3;
  }
  TVar2 = tkBool;
LAB_00170759:
  tryLiteral(this,pcVar1 + 1,sStack_20,TVar2);
  return TVar2;
}

Assistant:

JsonParser::Token JsonParser::doAdvance()
{
    char ch = next();
    if (ch == ']') {
        if (curState == stArray0 || stArrayN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkArrayEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == '}') {
        if (curState == stObject0 || stObjectN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkObjectEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == ',') {
        if (curState != stObjectN && curState != stArrayN) {
            throw unexpected(ch);
        }
        if (curState == stObjectN) {
            curState = stObject0;
        }
        ch = next();
    } else if (ch == ':') {
        if (curState != stKey) {
            throw unexpected(ch);
        }
        curState = stObjectN;
        ch = next();
    }

    if (curState == stObject0) {
        if (ch != '"') {
            throw unexpected(ch);
        }
        curState = stKey;
    } else if (curState == stArray0) {
        curState = stArrayN;
    }

    switch (ch) {
    case '[':
        stateStack.push(curState);
        curState = stArray0;
        return tkArrayStart;
    case '{':
        stateStack.push(curState);
        curState = stObject0;
        return tkObjectStart;
    case '"':
        return tryString();
    case 't':
        bv = true;
        return tryLiteral("rue", 3, tkBool);
    case 'f':
        bv = false;
        return tryLiteral("alse", 4, tkBool);
    case 'n':
        return tryLiteral("ull", 3, tkNull);
    default:
        if (isdigit(ch) || ch == '-') {
            return tryNumber(ch);
        } else {
            throw unexpected(ch);
        }
    }
}